

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int cjne_a_mem_offset(em8051 *aCPU)

{
  uint uVar1;
  uint local_18;
  int value;
  int address;
  em8051 *aCPU_local;
  
  uVar1 = (uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)];
  if (uVar1 < 0x80) {
    local_18 = (uint)aCPU->mLowerData[(int)uVar1];
  }
  else if (aCPU->sfrread == (em8051sfrread)0x0) {
    local_18 = (uint)aCPU->mSFR[(int)(uVar1 - 0x80)];
  }
  else {
    local_18 = (*aCPU->sfrread)(aCPU,uVar1);
  }
  if ((int)(uint)aCPU->mSFR[0x60] < (int)local_18) {
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] | 0x80;
  }
  else {
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] & 0x7f;
  }
  if (aCPU->mSFR[0x60] == local_18) {
    aCPU->mPC = aCPU->mPC + 3;
  }
  else {
    aCPU->mPC = (char)aCPU->mCodeMem[(int)(aCPU->mPC + 2U & aCPU->mCodeMemSize - 1U)] + 3 +
                aCPU->mPC;
  }
  return 1;
}

Assistant:

static int cjne_a_mem_offset(struct em8051 *aCPU)
{
    int address = OPERAND1;
    int value;
    if (address > 0x7f)
    {
        if (aCPU->sfrread)
            value = aCPU->sfrread(aCPU, address);
        else
            value = aCPU->mSFR[address - 0x80];
    }
    else
    {
        value = aCPU->mLowerData[address];
    }  

    if (ACC < value)
    {
        PSW |= PSWMASK_C;
    }
    else
    {
        PSW &= ~PSWMASK_C;
    }

    if (ACC != value)
    {
        PC += (signed char)OPERAND2 + 3;
    }
    else
    {
        PC += 3;
    }
    return 1;
}